

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int getToken(uchar **pz)

{
  int iVar1;
  int local_1c;
  uchar *puStack_18;
  int t;
  uchar *z;
  uchar **pz_local;
  
  puStack_18 = *pz;
  z = (uchar *)pz;
  do {
    iVar1 = sqlite3GetToken(puStack_18,&local_1c);
    puStack_18 = puStack_18 + iVar1;
  } while (local_1c == 0xae);
  if ((((local_1c != 0x3b) && (local_1c != 0x6e)) && (local_1c != 0x6f)) &&
     ((local_1c != 0x9c && (local_1c != 0x9d)))) {
    iVar1 = sqlite3ParserFallback(local_1c);
    if (iVar1 != 0x3b) goto LAB_00196215;
  }
  local_1c = 0x3b;
LAB_00196215:
  *(uchar **)z = puStack_18;
  return local_1c;
}

Assistant:

static int getToken(const unsigned char **pz){
  const unsigned char *z = *pz;
  int t;                          /* Token type to return */
  do {
    z += sqlite3GetToken(z, &t);
  }while( t==TK_SPACE );
  if( t==TK_ID 
   || t==TK_STRING 
   || t==TK_JOIN_KW 
   || t==TK_WINDOW 
   || t==TK_OVER 
   || sqlite3ParserFallback(t)==TK_ID 
  ){
    t = TK_ID;
  }
  *pz = z;
  return t;
}